

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseStatement,slang::ast::CaseStatementCondition&,slang::ast::CaseStatementCheck&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::CaseStatement::ItemGroup,18446744073709551615ul>,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,CaseStatementCondition *args,CaseStatementCheck *args_1,
          Expression *args_2,
          span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *args_3,
          Statement **args_4,SourceRange *args_5)

{
  CaseStatementCheck condition;
  CaseStatementCheck check;
  span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *expr;
  CaseStatement *this_00;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> local_48;
  Statement **local_38;
  Statement **args_local_4;
  span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *args_local_3;
  Expression *args_local_2;
  CaseStatementCheck *args_local_1;
  CaseStatementCondition *args_local;
  BumpAllocator *this_local;
  
  local_38 = args_4;
  args_local_4 = (Statement **)args_3;
  args_local_3 = (span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)args_2;
  args_local_2 = (Expression *)args_1;
  args_local_1 = args;
  args_local = (CaseStatementCondition *)this;
  this_00 = (CaseStatement *)allocate(this,0x48,8);
  expr = args_local_3;
  condition = *args_local_1;
  check = args_local_2->kind;
  nonstd::span_lite::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::
  span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL,_0>
            (&local_48,
             (span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)args_local_4);
  ast::CaseStatement::CaseStatement
            (this_00,condition,check,(Expression *)expr,local_48,*local_38,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }